

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symtab.c
# Opt level: O0

int symtab_get(symtab *tab,char *name,int *ptype,int *pdata)

{
  int *piVar1;
  uint32_t uVar2;
  int iVar3;
  int local_34;
  int i;
  int *pdata_local;
  int *ptype_local;
  char *name_local;
  symtab *tab_local;
  
  piVar1 = tab->buckets;
  uVar2 = elf_hash(name);
  local_34 = piVar1[(ulong)uVar2 % (ulong)(uint)tab->bucketsnum];
  while( true ) {
    if (local_34 == -1) {
      return -1;
    }
    iVar3 = strcmp(tab->syms[local_34].name,name);
    if (iVar3 == 0) break;
    local_34 = tab->syms[local_34].hchain;
  }
  if (ptype != (int *)0x0) {
    *ptype = tab->syms[local_34].type;
  }
  if (pdata != (int *)0x0) {
    *pdata = tab->syms[local_34].data;
  }
  return local_34;
}

Assistant:

int symtab_get(struct symtab *tab, const char *name, int *ptype, int *pdata) {
	int i = tab->buckets[elf_hash(name) % tab->bucketsnum];
	while (i != -1) {
		if (!strcmp(tab->syms[i].name, name)) {
			if (ptype)
				*ptype = tab->syms[i].type;
			if (pdata)
				*pdata = tab->syms[i].data;
			return i;
		}
		i = tab->syms[i].hchain;
	}
	return -1;
}